

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConnection.cxx
# Opt level: O2

void cmEventBasedConnection::on_read(uv_stream_t *stream,ssize_t nread,uv_buf_t *buf)

{
  long *plVar1;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  plVar1 = (long *)stream->data;
  if (plVar1 != (long *)0x0) {
    if (nread < 0) {
      (**(code **)(*plVar1 + 0x50))(plVar1,nread & 0xffffffff);
    }
    else {
      local_38[0] = local_28;
      std::__cxx11::string::_M_construct<char*>((string *)local_38,buf->base,buf->base + nread);
      (**(code **)(*plVar1 + 0x48))(plVar1,local_38);
      std::__cxx11::string::~string((string *)local_38);
    }
  }
  if (buf->base != (char *)0x0) {
    operator_delete__(buf->base);
  }
  return;
}

Assistant:

void cmEventBasedConnection::on_read(uv_stream_t* stream, ssize_t nread,
                                     const uv_buf_t* buf)
{
  auto conn = static_cast<cmEventBasedConnection*>(stream->data);
  if (conn) {
    if (nread >= 0) {
      conn->ReadData(std::string(buf->base, buf->base + nread));
    } else {
      conn->OnDisconnect(static_cast<int>(nread));
    }
  }

  delete[](buf->base);
}